

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void load_frames(char *fn,int start,int n_frame,int x,int y,qnode_ptr_t cub,int bin)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  string t;
  uchar hd [32];
  string s1;
  string s2;
  char local_148 [80];
  uchar local_f8 [32];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < n_frame) {
    uVar5 = 0;
    do {
      sprintf(local_d8,"%d",(ulong)(uint)start);
      sVar3 = 0xffffffffffffffff;
      do {
        cVar1 = fn[sVar3 + 1];
        local_148[sVar3 + 1] = cVar1;
        sVar3 = sVar3 + 1;
      } while (cVar1 != '\0');
      sVar2 = sVar3;
      do {
        sVar4 = sVar2;
        cVar1 = local_d8[sVar4 - (long)(int)sVar3];
        local_148[sVar4] = cVar1;
        sVar2 = sVar4 + 1;
      } while (cVar1 != '\0');
      local_148[sVar4] = '\0';
      memcpy(local_88,local_148,sVar4 + 1);
      if (bin == 0) {
        pgetrast(local_88,local_f8,*cub->gauss_ptr[uVar5],x,y,0x13c);
      }
      else {
        Bpgetrast(local_88,*cub->gauss_ptr[uVar5],x,y,0x13c);
      }
      start = start + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)n_frame);
  }
  return;
}

Assistant:

void load_frames(fn,start,n_frame,x,y,cub,bin)
string fn ;
int start, n_frame, x, y, bin ;
qnode_ptr_t cub ;

{ unsigned char hd[H] ;
  string s1, s2 ;
  int i ;

  for (i = 0 ; i < n_frame ; i++) {
    sprintf(s1,"%d",start);
    concat(fn,s1,s2) ;
    if (!bin) {
      pgetrast(s2,hd,cub->gauss_ptr[i],x,y,X) ;
    }
    else {
      Bpgetrast(s2,cub->gauss_ptr[i],x,y,X) ;
    }
    start++ ;
  }
}